

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O0

CURLcode tool_setopt(CURL *curl,_Bool str,GlobalConfig *config,char *name,CURLoption tag,...)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  NameValue *local_220;
  curl_off_t oval;
  void *pval;
  NameValue *nv;
  long defval;
  long lval;
  char *pcStack_160;
  CURLcode ret;
  char *escaped;
  _Bool escape;
  _Bool skip;
  char *pcStack_150;
  _Bool remark;
  char *value;
  char buf [256];
  va_list arg;
  CURLoption tag_local;
  char *name_local;
  GlobalConfig *config_local;
  _Bool str_local;
  CURL *curl_local;
  
  if (tag < 10000) {
    buf[0xfc] = '0';
    buf[0xfd] = '\0';
    buf[0xfe] = '\0';
    buf[0xff] = '\0';
    buf[0xf8] = '0';
    buf[0xf9] = '\0';
    buf[0xfa] = '\0';
    buf[0xfb] = '\0';
    escaped._7_1_ = false;
    bVar1 = false;
    nv = (NameValue *)0x0;
    for (pval = setopt_nv_CURLNONZERODEFAULTS; *pval != 0; pval = (void *)((long)pval + 0x10)) {
      iVar2 = strcmp(name,*pval);
      if (iVar2 == 0) {
        nv = *(NameValue **)((long)pval + 8);
        break;
      }
    }
    curl_msnprintf(&value,0x100,"%ldL",local_220);
    pcStack_150 = (char *)&value;
    lval._4_4_ = curl_easy_setopt(curl,tag,local_220);
    bVar3 = local_220 == nv;
  }
  else if (tag < 30000) {
    buf[0xfc] = '0';
    buf[0xfd] = '\0';
    buf[0xfe] = '\0';
    buf[0xff] = '\0';
    buf[0xf8] = '0';
    buf[0xf9] = '\0';
    buf[0xfa] = '\0';
    buf[0xfb] = '\0';
    pcStack_150 = (char *)0x0;
    escaped._7_1_ = false;
    bVar3 = false;
    bVar1 = false;
    if (tag < 20000) {
      if ((local_220 == (NameValue *)0x0) || (!str)) {
        bVar3 = local_220 == (NameValue *)0x0;
        if (!bVar3) {
          pcStack_150 = "objectpointer";
        }
        escaped._7_1_ = !bVar3;
      }
      else {
        bVar1 = true;
        pcStack_150 = (char *)local_220;
      }
    }
    else {
      bVar3 = local_220 == (NameValue *)0x0;
      if (!bVar3) {
        pcStack_150 = "functionpointer";
      }
      escaped._7_1_ = !bVar3;
    }
    lval._4_4_ = curl_easy_setopt(curl,tag,local_220);
  }
  else {
    buf[0xfc] = '0';
    buf[0xfd] = '\0';
    buf[0xfe] = '\0';
    buf[0xff] = '\0';
    buf[0xf8] = '0';
    buf[0xf9] = '\0';
    buf[0xfa] = '\0';
    buf[0xfb] = '\0';
    escaped._7_1_ = false;
    bVar1 = false;
    curl_msnprintf(&value,0x100,"(curl_off_t)%ld",local_220);
    pcStack_150 = (char *)&value;
    lval._4_4_ = curl_easy_setopt(curl,tag,local_220);
    bVar3 = local_220 == (NameValue *)0x0;
  }
  pcStack_160 = (char *)0x0;
  if (((config->libcurl != (char *)0x0) && (!bVar3)) && (lval._4_4_ == CURLE_OK)) {
    if (escaped._7_1_) {
      lval._4_4_ = easysrc_addf(&easysrc_toohard,"%s set to a %s",name,pcStack_150);
    }
    else if (bVar1) {
      pcStack_160 = c_escape(pcStack_150,0xffffffffffffffff);
      if (pcStack_160 == (char *)0x0) {
        lval._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      else {
        lval._4_4_ = easysrc_addf(&easysrc_code,"curl_easy_setopt(hnd, %s, \"%s\");",name,
                                  pcStack_160);
      }
    }
    else {
      lval._4_4_ = easysrc_addf(&easysrc_code,"curl_easy_setopt(hnd, %s, %s);",name,pcStack_150);
    }
  }
  free(pcStack_160);
  return lval._4_4_;
}

Assistant:

CURLcode tool_setopt(CURL *curl, bool str, struct GlobalConfig *config,
                     const char *name, CURLoption tag, ...)
{
  va_list arg;
  char buf[256];
  const char *value = NULL;
  bool remark = FALSE;
  bool skip = FALSE;
  bool escape = FALSE;
  char *escaped = NULL;
  CURLcode ret = CURLE_OK;

  va_start(arg, tag);

  if(tag < CURLOPTTYPE_OBJECTPOINT) {
    /* Value is expected to be a long */
    long lval = va_arg(arg, long);
    long defval = 0L;
    const NameValue *nv = NULL;
    for(nv = setopt_nv_CURLNONZERODEFAULTS; nv->name; nv++) {
      if(!strcmp(name, nv->name)) {
        defval = nv->value;
        break; /* found it */
      }
    }

    msnprintf(buf, sizeof(buf), "%ldL", lval);
    value = buf;
    ret = curl_easy_setopt(curl, tag, lval);
    if(lval == defval)
      skip = TRUE;
  }
  else if(tag < CURLOPTTYPE_OFF_T) {
    /* Value is some sort of object pointer */
    void *pval = va_arg(arg, void *);

    /* function pointers are never printable */
    if(tag >= CURLOPTTYPE_FUNCTIONPOINT) {
      if(pval) {
        value = "functionpointer";
        remark = TRUE;
      }
      else
        skip = TRUE;
    }

    else if(pval && str) {
      value = (char *)pval;
      escape = TRUE;
    }
    else if(pval) {
      value = "objectpointer";
      remark = TRUE;
    }
    else
      skip = TRUE;

    ret = curl_easy_setopt(curl, tag, pval);

  }
  else {
    /* Value is expected to be curl_off_t */
    curl_off_t oval = va_arg(arg, curl_off_t);
    msnprintf(buf, sizeof(buf),
              "(curl_off_t)%" CURL_FORMAT_CURL_OFF_T, oval);
    value = buf;
    ret = curl_easy_setopt(curl, tag, oval);

    if(!oval)
      skip = TRUE;
  }

  va_end(arg);

  if(config->libcurl && !skip && !ret) {
    /* we only use this for real if --libcurl was used */

    if(remark)
      REM2("%s set to a %s", name, value);
    else {
      if(escape) {
        escaped = c_escape(value, CURL_ZERO_TERMINATED);
        NULL_CHECK(escaped);
        CODE2("curl_easy_setopt(hnd, %s, \"%s\");", name, escaped);
      }
      else
        CODE2("curl_easy_setopt(hnd, %s, %s);", name, value);
    }
  }

 nomem:
  Curl_safefree(escaped);
  return ret;
}